

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjasm.cpp
# Opt level: O0

void __thiscall
Options::COptionsParser::GetOptions(COptionsParser *this,char **argv,int *i,bool onlySyntaxOptions)

{
  char *pcVar1;
  int iVar2;
  bool bVar3;
  char *local_3068;
  SSource local_3040;
  char local_2038 [8];
  char defV_1 [2048];
  char defN_1 [2048];
  char defV [2048];
  char defN [2048];
  char *defarg;
  bool doubleDash;
  bool onlySyntaxOptions_local;
  int *i_local;
  char **argv_local;
  COptionsParser *this_local;
  
  while( true ) {
    pcVar1 = argv[*i];
    this->arg = pcVar1;
    bVar3 = false;
    if (pcVar1 != (char *)0x0) {
      bVar3 = *this->arg == '-';
    }
    if (!bVar3) break;
    bVar3 = false;
    if (this->arg[1] == '-') {
      bVar3 = true;
      splitByChar(this->arg + 2,0x3d,this->opt,0x800,this->val,0x800);
    }
    else {
      this->opt[0] = this->arg[1];
      this->opt[1] = '\0';
      if (this->opt[0] != '\0') {
        strcpy(this->val,this->arg + 2);
      }
    }
    iVar2 = strcmp(this->opt,"zxnext");
    if (iVar2 == 0) {
      if ((IsI8080 & 1) != 0) {
        Error("Can\'t enable Next extensions while in i8080 mode",(char *)0x0,FATAL);
      }
      if ((IsLR35902 & 1) != 0) {
        Error("Can\'t enable Next extensions while in Sharp LR35902 mode",(char *)0x0,FATAL);
      }
      DAT_001e16a8._4_4_ = 1;
      iVar2 = strcmp(this->val,"cspect");
      if (iVar2 == 0) {
        DAT_001e16a8._4_4_ = 2;
      }
    }
    else {
      iVar2 = strcmp(this->opt,"reversepop");
      if (iVar2 == 0) {
        DAT_001e1699 = 1;
      }
      else {
        iVar2 = strcmp(this->opt,"dirbol");
        if (iVar2 == 0) {
          syx = 1;
        }
        else {
          iVar2 = strcmp(this->opt,"nofakes");
          if (iVar2 == 0) {
            DAT_001e169a = 0;
          }
          else {
            iVar2 = strcmp(this->opt,"syntax");
            if (iVar2 == 0) {
              parseSyntaxValue(this);
            }
            else if ((bVar3) || (this->opt[0] != 'W')) {
              if (onlySyntaxOptions) {
                return;
              }
              iVar2 = strcmp(this->opt,"lr35902");
              if (iVar2 == 0) {
                IsLR35902 = 1;
                IsI8080 = 0;
                DAT_001e16a8._4_4_ = 0;
              }
              else {
                iVar2 = strcmp(this->opt,"i8080");
                if (iVar2 == 0) {
                  IsI8080 = 1;
                  IsLR35902 = 0;
                  DAT_001e16a8._4_4_ = 0;
                }
                else if ((((!bVar3) && (this->opt[0] == 'h')) && (this->val[0] == '\0')) ||
                        ((bVar3 && (iVar2 = strcmp(this->opt,"help"), iVar2 == 0)))) {
                  iVar2 = strcmp("warnings",this->val);
                  ShowHelp = (ShowHelp & 1) != 0 || iVar2 != 0;
                  iVar2 = strcmp("warnings",this->val);
                  ShowHelpWarnings = (ShowHelpWarnings & 1) != 0 || iVar2 == 0;
                }
                else if ((bVar3) && (iVar2 = strcmp(this->opt,"version"), iVar2 == 0)) {
                  ShowVersion = 1;
                }
                else {
                  iVar2 = strcmp(this->opt,"lstlab");
                  if (iVar2 == 0) {
                    AddLabelListing = 1;
                    if (this->val[0] != '\0') {
                      iVar2 = strcmp("sort",this->val);
                      SortSymbols = (iVar2 != 0 ^ 0xffU) & 1;
                    }
                  }
                  else {
                    iVar2 = strcmp(this->opt,"longptr");
                    if (iVar2 == 0) {
                      IsLongPtr = 1;
                    }
                    else {
                      iVar2 = strcmp(this->opt,"msg");
                      if (iVar2 == 0) {
                        iVar2 = strcmp("none",this->val);
                        if (iVar2 == 0) {
                          OutputVerbosity = 3;
                          HideLogo = 1;
                        }
                        else {
                          iVar2 = strcmp("err",this->val);
                          if (iVar2 == 0) {
                            OutputVerbosity = 2;
                          }
                          else {
                            iVar2 = strcmp("war",this->val);
                            if (iVar2 == 0) {
                              OutputVerbosity = 1;
                            }
                            else {
                              iVar2 = strcmp("all",this->val);
                              if (iVar2 == 0) {
                                OutputVerbosity = 0;
                              }
                              else {
                                iVar2 = strcmp("lst",this->val);
                                if (iVar2 == 0) {
                                  OutputVerbosity = 4;
                                  AddLabelListing = 0;
                                  HideLogo = 1;
                                }
                                else {
                                  iVar2 = strcmp("lstlab",this->val);
                                  if (iVar2 == 0) {
                                    OutputVerbosity = 4;
                                    AddLabelListing = 1;
                                    SortSymbols = 1;
                                    HideLogo = 1;
                                  }
                                  else {
                                    Error("unexpected parameter in",this->arg,ALL);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                      else {
                        iVar2 = strcmp(this->opt,"lst");
                        if ((iVar2 == 0) && (this->val[0] == '\0')) {
                          IsDefaultListingName = 1;
                        }
                        else {
                          iVar2 = strcmp(this->opt,"sld");
                          if ((iVar2 == 0) && (this->val[0] == '\0')) {
                            IsDefaultSldName = 1;
                          }
                          else {
                            iVar2 = CheckAssignmentOption
                                              (this,"outprefix",(path *)OutPrefix_abi_cxx11_);
                            if ((((iVar2 == 0) &&
                                 (iVar2 = CheckAssignmentOption
                                                    (this,"sym",(path *)SymbolListFName_abi_cxx11_),
                                 iVar2 == 0)) &&
                                (iVar2 = CheckAssignmentOption
                                                   (this,"lst",(path *)ListingFName_abi_cxx11_),
                                iVar2 == 0)) &&
                               (((iVar2 = CheckAssignmentOption
                                                    (this,"exp",(path *)ExportFName_abi_cxx11_),
                                 iVar2 == 0 &&
                                 (iVar2 = CheckAssignmentOption
                                                    (this,"sld",
                                                     (path *)SourceLevelDebugFName_abi_cxx11_),
                                 iVar2 == 0)) &&
                                (iVar2 = CheckAssignmentOption
                                                   (this,"raw",(path *)RAWFName_abi_cxx11_),
                                iVar2 == 0)))) {
                              iVar2 = strcmp(this->opt,"fullpath");
                              if (iVar2 == 0) {
                                iVar2 = strcmp("on",this->val);
                                if (iVar2 == 0) {
                                  FileVerbosity = 2;
                                }
                                else if ((this->val[0] == '\0') ||
                                        (iVar2 = strcmp("rel",this->val), iVar2 == 0)) {
                                  FileVerbosity = 1;
                                }
                                else {
                                  iVar2 = strcmp("off",this->val);
                                  if (iVar2 == 0) {
                                    FileVerbosity = 0;
                                  }
                                  else {
                                    Error("invalid --fullpath setting (use: on|rel|off)",this->val,
                                          ALL);
                                  }
                                }
                              }
                              else {
                                iVar2 = strcmp(this->opt,"color");
                                if (iVar2 == 0) {
                                  iVar2 = strcmp("on",this->val);
                                  if (iVar2 == 0) {
                                    SetTerminalColors(true);
                                  }
                                  else {
                                    iVar2 = strcmp("off",this->val);
                                    if (iVar2 == 0) {
                                      SetTerminalColors(false);
                                    }
                                    else {
                                      iVar2 = strcmp("auto",this->val);
                                      if (iVar2 != 0) {
                                        Error("invalid --color setting (use: on|off|auto)",this->val
                                              ,ALL);
                                      }
                                    }
                                  }
                                }
                                else {
                                  iVar2 = strcmp(this->opt,"nologo");
                                  if (iVar2 == 0) {
                                    HideLogo = 1;
                                  }
                                  else {
                                    iVar2 = strcmp(this->opt,"dos866");
                                    if (iVar2 == 0) {
                                      ConvertEncoding = 0;
                                    }
                                    else if (((bVar3) &&
                                             (iVar2 = strcmp(this->opt,"inc"), iVar2 == 0)) ||
                                            (((!bVar3 && (this->opt[0] == 'i')) ||
                                             ((!bVar3 && (this->opt[0] == 'I')))))) {
                                      if (this->val[0] == '\0') {
                                        if ((bVar3) && (this->arg[5] != '=')) {
                                          std::
                                          vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                                          ::clear((
                                                  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                                                  *)IncludeDirsList_abi_cxx11_);
                                        }
                                        else if ((argv[*i + 1] == (char *)0x0) ||
                                                (*argv[*i + 1] == '-')) {
                                          Error("no include path found for",this->arg,ALL);
                                        }
                                        else {
                                          iVar2 = *i;
                                          *i = iVar2 + 1;
                                          std::
                                          vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                                          ::emplace_back<char_const*const&>
                                                    ((
                                                  vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                                                  *)IncludeDirsList_abi_cxx11_,argv + (iVar2 + 1));
                                        }
                                      }
                                      else {
                                        std::
                                        vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                                        ::emplace_back<char(&)[2048]>
                                                  ((
                                                  vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                                                  *)IncludeDirsList_abi_cxx11_,&this->val);
                                      }
                                    }
                                    else {
                                      iVar2 = strcmp(this->opt,"define");
                                      if (iVar2 == 0) {
                                        if (argv[*i + 1] == (char *)0x0) {
                                          local_3068 = (char *)0x0;
                                        }
                                        else {
                                          iVar2 = *i;
                                          *i = iVar2 + 1;
                                          local_3068 = argv[iVar2 + 1];
                                        }
                                        memset(defV + 0x7f8,0,0x800);
                                        memset(defN_1 + 0x7f8,0,0x800);
                                        if (local_3068 != (char *)0x0) {
                                          splitByChar(local_3068,0x3d,defV + 0x7f8,0x800,
                                                      defN_1 + 0x7f8,0x800);
                                        }
                                        if (defV[0x7f8] == '\0') {
                                          Error("missing define value",local_3068,ALL);
                                        }
                                        else {
                                          CDefineTable::Add((CDefineTable *)CmdDefineTable,
                                                            defV + 0x7f8,defN_1 + 0x7f8,
                                                            (CStringsList *)0x0);
                                        }
                                      }
                                      else if ((bVar3) || (this->opt[0] != 'D')) {
                                        if ((bVar3) || (this->opt[0] != '\0')) {
                                          Error("unrecognized option",this->arg,ALL);
                                        }
                                        else {
                                          SSource::SSource(&local_3040,1);
                                          std::vector<SSource,_std::allocator<SSource>_>::push_back
                                                    (&sourceFiles,&local_3040);
                                          SSource::~SSource(&local_3040);
                                        }
                                      }
                                      else if (this->val[0] == '\0') {
                                        Error("no parameters found in",this->arg,ALL);
                                      }
                                      else {
                                        splitByChar(this->val,0x3d,defV_1 + 0x7f8,0x800,local_2038,
                                                    0x800);
                                        CDefineTable::Add((CDefineTable *)CmdDefineTable,
                                                          defV_1 + 0x7f8,local_2038,
                                                          (CStringsList *)0x0);
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            else {
              CliWoption(this->val);
            }
          }
        }
      }
    }
    *i = *i + 1;
  }
  return;
}

Assistant:

void GetOptions(const char* const * const argv, int& i, bool onlySyntaxOptions = false) {
			while ((arg=argv[i]) && ('-' == arg[0])) {
				bool doubleDash = false;
				// copy "option" (up to '=' char) into `opt`, copy "value" (after '=') into `val`
				if ('-' == arg[1]) {	// double-dash detected, value is expected after "="
					doubleDash = true;
					splitByChar(arg + 2, '=', opt, LINEMAX, val, LINEMAX);
				} else {				// single dash, parse value from second character onward
					opt[0] = arg[1];	// copy only single letter into `opt`
					opt[1] = 0;
					if (opt[0]) {		// if it was not empty, try to copy also `val`
						STRCPY(val, LINEMAX, arg + 2);
					}
				}

				// check for particular options and setup option value by it
				// first check all syntax-only options which may be modified by OPT directive
				if (!strcmp(opt, "zxnext")) {
					if (IsI8080) Error("Can't enable Next extensions while in i8080 mode", nullptr, FATAL);
					if (IsLR35902) Error("Can't enable Next extensions while in Sharp LR35902 mode", nullptr, FATAL);
					syx.IsNextEnabled = 1;
					if (!strcmp(val, "cspect")) syx.IsNextEnabled = 2;	// CSpect emulator extensions
				} else if (!strcmp(opt, "reversepop")) {
					syx.IsReversePOP = true;
				} else if (!strcmp(opt, "dirbol")) {
					syx.IsPseudoOpBOF = true;
				} else if (!strcmp(opt, "nofakes")) {
					syx.FakeEnabled = false;
					// was deprecated, as it is provided by `--syntax=F` too, but now I decided to keep also this older option
					// (it's less cryptic than the --syntax letter soup, one duplicity of functionality will not end the world, right?)
				} else if (!strcmp(opt, "syntax")) {
					parseSyntaxValue();
				} else if (!doubleDash && 'W' == opt[0]) {
					CliWoption(val);
				} else if (onlySyntaxOptions) {
					// rest of the options is available only when launching the sjasmplus
					return;
				} else if (!strcmp(opt, "lr35902")) {
					IsLR35902 = true;
					// force (silently) other CPU modes OFF
					IsI8080 = false;
					syx.IsNextEnabled = 0;
				} else if (!strcmp(opt, "i8080")) {
					IsI8080 = true;
					// force (silently) other CPU modes OFF
					IsLR35902 = false;
					syx.IsNextEnabled = 0;
				} else if ((!doubleDash && 'h' == opt[0] && !val[0]) || (doubleDash && !strcmp(opt, "help"))) {
					ShowHelp |= !!strcmp("warnings", val);
					ShowHelpWarnings |= !strcmp("warnings", val);
				} else if (doubleDash && !strcmp(opt, "version")) {
					ShowVersion = true;
				} else if (!strcmp(opt, "lstlab")) {
					AddLabelListing = true;
					if (val[0]) SortSymbols = !strcmp("sort", val);
				} else if (!strcmp(opt, "longptr")) {
					IsLongPtr = true;
				} else if (!strcmp(opt, "msg")) {
					if (!strcmp("none", val)) {
						OutputVerbosity = OV_NONE;
						HideLogo = true;
					} else if (!strcmp("err", val)) {
						OutputVerbosity = OV_ERROR;
					} else if (!strcmp("war", val)) {
						OutputVerbosity = OV_WARNING;
					} else if (!strcmp("all", val)) {
						OutputVerbosity = OV_ALL;
					} else if (!strcmp("lst", val)) {
						OutputVerbosity = OV_LST;
						AddLabelListing = false;
						HideLogo = true;
					} else if (!strcmp("lstlab", val)) {
						OutputVerbosity = OV_LST;
						AddLabelListing = true;
						SortSymbols = true;
						HideLogo = true;
					} else {
						Error("unexpected parameter in", arg, ALL);
					}
				} else if (!strcmp(opt, "lst") && !val[0]) {
					IsDefaultListingName = true;
				} else if (!strcmp(opt, "sld") && !val[0]) {
					IsDefaultSldName = true;
				} else if (
					CheckAssignmentOption("outprefix", OutPrefix) ||
					CheckAssignmentOption("sym", SymbolListFName) ||
					CheckAssignmentOption("lst", ListingFName) ||
					CheckAssignmentOption("exp", ExportFName) ||
					CheckAssignmentOption("sld", SourceLevelDebugFName) ||
					CheckAssignmentOption("raw", RAWFName) ) {
					// was proccessed inside CheckAssignmentOption function
				} else if (!strcmp(opt, "fullpath")) {
					if (!strcmp("on", val)) {
						FileVerbosity = FNAME_ABSOLUTE;
					} else if (!val[0] || !strcmp("rel", val)) {
						FileVerbosity = FNAME_LAUNCH_REL;
					} else if (!strcmp("off", val)) {
						FileVerbosity = FNAME_BASE;
					} else {
						Error("invalid --fullpath setting (use: on|rel|off)", val, ALL);
					}
				} else if (!strcmp(opt, "color")) {
					if (!strcmp("on", val)) {
						SetTerminalColors(true);
					} else if (!strcmp("off", val)) {
						SetTerminalColors(false);
					} else if (!strcmp("auto", val)) {
						// already heuristically detected, nothing to do
					} else {
						Error("invalid --color setting (use: on|off|auto)", val, ALL);
					}
				} else if (!strcmp(opt, "nologo")) {
					HideLogo = 1;
				} else if (!strcmp(opt, "dos866")) {
					ConvertEncoding = ENCDOS;
				} else if ((doubleDash && !strcmp(opt, "inc")) ||
							(!doubleDash && 'i' == opt[0]) ||
							(!doubleDash && 'I' == opt[0])) {
					if (*val) {
						IncludeDirsList.emplace_back(val);
					} else {
						if (!doubleDash || '=' == arg[5]) {
							if (argv[i+1] && '-' != argv[i+1][0]) {		// include path provided as next argument (after space, like gcc)
								IncludeDirsList.emplace_back(argv[++i]);
							} else {
								Error("no include path found for", arg, ALL);
							}
						} else {	// individual `--inc` without "= path" will RESET include dirs
							IncludeDirsList.clear();
						}
					}
				} else if (!strcmp(opt, "define")) {	// for --define name=value the next argv is used (if available)
					const char* defarg = argv[i+1] ? argv[++i] : nullptr;
					char defN[LINEMAX] {}, defV[LINEMAX] {};
					if (defarg) splitByChar(defarg, '=', defN, LINEMAX, defV, LINEMAX);
					if (*defN) CmdDefineTable.Add(defN, defV, nullptr);
					else Error("missing define value", defarg, ALL);
				} else if (!doubleDash && 'D' == opt[0]) {
					char defN[LINEMAX], defV[LINEMAX];
					if (*val) {		// for -Dname=value the `val` contains "name=value" string
						splitByChar(val, '=', defN, LINEMAX, defV, LINEMAX);
						CmdDefineTable.Add(defN, defV, NULL);
					} else {
						Error("no parameters found in", arg, ALL);
					}
				} else if (!doubleDash && 0 == opt[0]) {
					// only single "-" was on command line = source STDIN
					sourceFiles.push_back(SSource(1));		// special constructor for stdin input
				} else {
					Error("unrecognized option", arg, ALL);
				}

				++i;					// next CLI argument
			} // end of while ((arg=argv[i]) && ('-' == arg[0]))
		}